

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  anon_class_24_3_736b1486 fun;
  pointer pEVar2;
  reference input_00;
  long lVar3;
  ulong in_RDX;
  DataChunk *in_RDI;
  hugeint_t in;
  hugeint_t in_00;
  hugeint_t addition;
  hugeint_t multiply_power_of_ten;
  hugeint_t divide_power_of_ten;
  uint8_t width;
  uint8_t source_scale;
  RoundPrecisionFunctionData *info;
  BoundFunctionExpression *func_expr;
  size_type in_stack_fffffffffffffec8;
  FunctionData *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar4;
  undefined8 in_stack_fffffffffffffef8;
  hugeint_t *in_stack_ffffffffffffff00;
  BaseExpression *in_stack_ffffffffffffff10;
  hugeint_t local_e0;
  undefined1 local_d0 [16];
  duckdb *local_c0;
  uint64_t local_b8;
  hugeint_t local_b0;
  duckdb *local_a0;
  undefined8 local_98;
  hugeint_t local_90 [2];
  Value local_70 [70];
  byte local_2a;
  byte local_29;
  RoundPrecisionFunctionData *local_28;
  BoundFunctionExpression *local_20;
  ulong local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_ffffffffffffff10);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffed0);
  local_28 = FunctionData::Cast<duckdb::RoundPrecisionFunctionData>(in_stack_fffffffffffffed0);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffed0);
  local_29 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar2 + 0x38));
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffed0);
  local_2a = duckdb::DecimalType::GetWidth((LogicalType *)(pEVar2 + 0x38));
  iVar1 = local_28->target_scale;
  in.upper._0_4_ = (uint)local_2a - (uint)local_29;
  if (iVar1 == -(int)in.upper || SBORROW4(iVar1,-(int)in.upper) != iVar1 + (int)in.upper < 0) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    uVar4 = 0;
    duckdb::Value::INTEGER((int)local_70);
    duckdb::Vector::SetValue(local_18,(Value *)(ulong)uVar4);
    duckdb::Value::~Value(local_70);
  }
  else {
    lVar3 = (long)(int)((uint)local_29 - local_28->target_scale);
    local_a0 = (duckdb *)(&Hugeint::POWERS_OF_TEN)[lVar3 * 2];
    local_98 = *(undefined8 *)(duckdb::Value::DoubleIsFinite + lVar3 * 0x10);
    in.lower = local_98;
    in.upper._4_4_ = 0;
    local_90[0] = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>(local_a0,in);
    in_00.upper = local_90[0].upper;
    local_c0 = (duckdb *)(&Hugeint::POWERS_OF_TEN)[(long)-local_28->target_scale * 2];
    local_b8 = *(uint64_t *)(duckdb::Value::DoubleIsFinite + (long)-local_28->target_scale * 0x10);
    in_00.lower = local_b8;
    local_b0 = UnsafeNumericCast<duckdb::hugeint_t,duckdb::hugeint_t,void>(local_c0,in_00);
    duckdb::hugeint_t::hugeint_t(&local_e0,2);
    local_d0 = duckdb::hugeint_t::operator/(local_90,&local_e0);
    input_00 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffec8);
    DataChunk::size(local_8);
    fun.addition._4_4_ = in_stack_fffffffffffffef4;
    fun.addition._0_4_ = in_stack_fffffffffffffef0;
    fun.divide_power_of_ten = (hugeint_t *)in_stack_fffffffffffffef8;
    fun.multiply_power_of_ten = in_stack_ffffffffffffff00;
    UnaryExecutor::
    Execute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_>
              (input_00,(Vector *)&local_b0,(idx_t)local_90,fun,
               (FunctionErrors)((ulong)local_d0 >> 0x38));
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}